

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMMSegment.hpp
# Opt level: O2

void __thiscall
cppjieba::HMMSegment::Viterbi
          (HMMSegment *this,const_iterator begin,const_iterator end,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *status)

{
  size_type __n;
  HMMModel *this_00;
  pointer puVar1;
  ulong uVar2;
  int x;
  ulong uVar3;
  ulong uVar4;
  unsigned_long uVar5;
  double *pdVar6;
  long lVar7;
  size_t y_1;
  double *pdVar8;
  long lVar9;
  size_t y;
  long lVar10;
  long lVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  allocator_type local_89;
  double local_88;
  const_iterator local_80;
  ulong local_78;
  vector<double,_std::allocator<double>_> weight;
  vector<int,_std::allocator<int>_> path;
  
  uVar3 = ((long)end - (long)begin) / 0x14;
  __n = uVar3 * 4;
  std::vector<int,_std::allocator<int>_>::vector(&path,__n,(allocator_type *)&weight);
  std::vector<double,_std::allocator<double>_>::vector(&weight,__n,&local_89);
  lVar7 = 0;
  for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
    this_00 = this->model_;
    local_88 = this_00->startProb[lVar10];
    dVar12 = HMMModel::GetEmitProb
                       (this_00,(this_00->emitProbVec).
                                super__Vector_base<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*,_std::allocator<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar10],begin->rune,
                        -3.14e+100);
    *(double *)
     ((long)weight.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start + lVar7 * 2) = local_88 + dVar12;
    *(undefined4 *)
     ((long)path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start + lVar7) = 0xffffffff;
    lVar7 = lVar7 + __n;
  }
  local_88 = 0.0;
  local_78 = uVar3;
  for (uVar4 = 1; uVar2 = local_78, uVar4 < local_78; uVar4 = uVar4 + 1) {
    local_80 = begin + uVar4;
    lVar7 = 0x28;
    for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
      lVar11 = lVar10 * local_78 + uVar4;
      weight.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar11] = -3.14e+100;
      path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [lVar11] = 1;
      dVar13 = HMMModel::GetEmitProb
                         (this->model_,
                          (this->model_->emitProbVec).
                          super__Vector_base<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*,_std::allocator<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar10],local_80->rune,
                          -3.14e+100);
      dVar12 = weight.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar11];
      pdVar6 = (double *)(this->model_->statMap + lVar7);
      pdVar8 = (double *)
               ((long)local_88 +
               (long)weight.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start);
      for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
        dVar14 = *pdVar8 + *pdVar6 + dVar13;
        if (dVar12 < dVar14) {
          weight.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
          ._M_start[lVar11] = dVar14;
          path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar11] = (int)lVar9;
          dVar12 = dVar14;
        }
        pdVar6 = pdVar6 + 4;
        pdVar8 = pdVar8 + uVar3;
      }
      lVar7 = lVar7 + 8;
    }
    local_88 = (double)((long)local_88 + 8);
  }
  local_88 = weight.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[local_78 * 2 + -1];
  local_80 = (const_iterator)
             weight.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[local_78 * 4 + -1];
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(status,local_78);
  uVar5 = (ulong)(local_88 < (double)local_80) * 2 + 1;
  puVar1 = (status->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar3 = uVar2 - 1; -1 < (int)uVar3; uVar3 = (ulong)((int)uVar3 - 1)) {
    puVar1[uVar3 & 0xffffffff] = uVar5;
    uVar5 = (unsigned_long)
            path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar5 * uVar2 + (uVar3 & 0xffffffff)];
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&weight.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&path.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void Viterbi(RuneStrArray::const_iterator begin, 
        RuneStrArray::const_iterator end, 
        vector<size_t>& status) const {
    size_t Y = HMMModel::STATUS_SUM;
    size_t X = end - begin;

    size_t XYSize = X * Y;
    size_t now, old, stat;
    double tmp, endE, endS;

    vector<int> path(XYSize);
    vector<double> weight(XYSize);

    //start
    for (size_t y = 0; y < Y; y++) {
      weight[0 + y * X] = model_->startProb[y] + model_->GetEmitProb(model_->emitProbVec[y], begin->rune, MIN_DOUBLE);
      path[0 + y * X] = -1;
    }

    double emitProb;

    for (size_t x = 1; x < X; x++) {
      for (size_t y = 0; y < Y; y++) {
        now = x + y*X;
        weight[now] = MIN_DOUBLE;
        path[now] = HMMModel::E; // warning
        emitProb = model_->GetEmitProb(model_->emitProbVec[y], (begin+x)->rune, MIN_DOUBLE);
        for (size_t preY = 0; preY < Y; preY++) {
          old = x - 1 + preY * X;
          tmp = weight[old] + model_->transProb[preY][y] + emitProb;
          if (tmp > weight[now]) {
            weight[now] = tmp;
            path[now] = preY;
          }
        }
      }
    }

    endE = weight[X-1+HMMModel::E*X];
    endS = weight[X-1+HMMModel::S*X];
    stat = 0;
    if (endE >= endS) {
      stat = HMMModel::E;
    } else {
      stat = HMMModel::S;
    }

    status.resize(X);
    for (int x = X -1 ; x >= 0; x--) {
      status[x] = stat;
      stat = path[x + stat*X];
    }
  }